

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

uint64_t __thiscall
hbm::streaming::SubscribedSignal::interpreteNtpTimestamp(SubscribedSignal *this,uchar *pData)

{
  __uint64_t *in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x70) == 0) {
    if ((*(byte *)(in_RDI + 0x5c) & 1) == 0) {
      local_8 = __uint64_identity(*in_RSI);
    }
    else {
      local_8 = __bswap_64(*in_RSI);
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t SubscribedSignal::interpreteNtpTimestamp(unsigned char* pData)
		{
			if(m_dataTimeType == TIMETYPE_NTP) {
				if(m_dataIsBigEndian) {
					return be64toh(*reinterpret_cast < uint64_t* > (pData));
				} else {
					return le64toh(*reinterpret_cast < uint64_t* > (pData));
				}
			} else {
				return 0;
			}
		}